

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O3

void __thiscall
ot::commissioner::FileLogger::Log(FileLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  int iVar1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  stringstream logStream;
  char *local_200;
  long local_1f8;
  char local_1f0 [16];
  string local_1e0;
  undefined8 local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mLogMutex);
  if (iVar1 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    if ((aLevel <= this->mLogLevel) && (this->mLogFile != (FILE *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
      auVar3 = std::chrono::_V2::system_clock::now();
      local_1c0 = auVar3._0_8_;
      TimePointToString_abi_cxx11_(&local_1e0,(commissioner *)&local_1c0,auVar3._8_8_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ] ",3);
      local_200 = local_1f0;
      local_1f8 = 0;
      local_1f0[0] = '\0';
      if (kDebug < aLevel) goto LAB_0012a982;
      std::__cxx11::string::_M_replace
                ((ulong)&local_200,0,(char *)0x0,
                 (ulong)(&DAT_00238104 + *(int *)(&DAT_00238104 + (ulong)aLevel * 4)));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_200,local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," [ ",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(aRegion->_M_dataplus)._M_p,aRegion->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ] ",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(aMsg->_M_dataplus)._M_p,aMsg->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_200 != local_1f0) {
        operator_delete(local_200);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      fputs(local_1e0._M_dataplus._M_p,(FILE *)this->mLogFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mLogMutex);
    return;
  }
  std::__throw_system_error(iVar1);
LAB_0012a982:
  abort();
}

Assistant:

void FileLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    std::lock_guard<std::mutex> _(mLogMutex);
    std::stringstream           logStream;

    VerifyOrExit(aLevel <= mLogLevel);
    VerifyOrExit(mLogFile != nullptr);

    logStream << "[ " << TimePointToString(Clock::now()) << " ] " << ToString(aLevel) << " [ " << aRegion << " ] "
              << aMsg << std::endl;
    fputs(logStream.str().c_str(), mLogFile);

exit:
    return;
}